

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O3

Id __thiscall
spv::Builder::makePointerDebugType(Builder *this,StorageClass storageClass,Id baseType)

{
  ulong uVar1;
  pointer puVar2;
  iterator __position;
  Id IVar3;
  Id IVar4;
  Id IVar5;
  mapped_type_conflict *pmVar6;
  mapped_type *pmVar7;
  Instruction *pIVar8;
  vector<spv::Instruction*,std::allocator<spv::Instruction*>> *this_00;
  pointer ppIVar9;
  Id IVar10;
  Instruction *type;
  Instruction *local_50;
  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_48;
  _Head_base<0UL,_spv::Instruction_*,_false> local_40;
  Id local_34;
  
  local_34 = baseType;
  pmVar6 = std::
           map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
           ::operator[](&this->debugId,&local_34);
  IVar5 = *pmVar6;
  if (IVar5 == 0) {
    IVar5 = makeDebugInfoNone(this);
  }
  else {
    IVar3 = makeIntegerType(this,0x20,false);
    IVar3 = makeIntConstant(this,IVar3,storageClass,false);
    local_50 = (Instruction *)CONCAT44(local_50._4_4_,3);
    pmVar7 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->groupedDebugTypes,(key_type *)&local_50);
    for (ppIVar9 = (pmVar7->
                   super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>).
                   _M_impl.super__Vector_impl_data._M_start;
        ppIVar9 !=
        (pmVar7->super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>).
        _M_impl.super__Vector_impl_data._M_finish; ppIVar9 = ppIVar9 + 1) {
      pIVar8 = *ppIVar9;
      uVar1 = *(pIVar8->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
      if ((uVar1 & 4) == 0) {
LAB_004559b3:
        __assert_fail("idOperand[op]",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/spvIR.h"
                      ,0xa1,"Id spv::Instruction::getIdOperand(int) const");
      }
      puVar2 = (pIVar8->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (puVar2[2] == IVar5) {
        if ((uVar1 & 8) == 0) goto LAB_004559b3;
        if (puVar2[3] == IVar3) {
          return pIVar8->resultId;
        }
      }
    }
    local_48 = (_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                *)&this->groupedDebugTypes;
    pIVar8 = (Instruction *)operator_new(0x60);
    IVar10 = this->uniqueId + 1;
    this->uniqueId = IVar10;
    IVar4 = makeVoidType(this);
    pIVar8->_vptr_Instruction = (_func_int **)&PTR__Instruction_00afab78;
    pIVar8->resultId = IVar10;
    pIVar8->typeId = IVar4;
    pIVar8->opCode = OpExtInst;
    (pIVar8->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    (pIVar8->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_finish.super__Bit_iterator_base._M_offset = 0;
    (pIVar8->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pIVar8->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pIVar8->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pIVar8->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    (pIVar8->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_offset = 0;
    (pIVar8->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
    pIVar8->block = (Block *)0x0;
    local_50 = pIVar8;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(&pIVar8->operands,5);
    if ((pIVar8->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_end_of_storage ==
        (pIVar8->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) {
      std::vector<bool,_std::allocator<bool>_>::_M_reallocate(&pIVar8->idOperand,5);
    }
    Instruction::addIdOperand(pIVar8,this->nonSemanticShaderDebugInfo);
    Instruction::addImmediateOperand(pIVar8,3);
    Instruction::addIdOperand(pIVar8,IVar5);
    Instruction::addIdOperand(pIVar8,IVar3);
    IVar5 = makeIntegerType(this,0x20,false);
    IVar5 = makeIntConstant(this,IVar5,0,false);
    Instruction::addIdOperand(pIVar8,IVar5);
    local_40._M_head_impl._0_4_ = 3;
    this_00 = (vector<spv::Instruction*,std::allocator<spv::Instruction*>> *)
              std::__detail::
              _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[](local_48,(key_type *)&local_40);
    __position._M_current = *(Instruction ***)(this_00 + 8);
    if (__position._M_current == *(Instruction ***)(this_00 + 0x10)) {
      std::vector<spv::Instruction*,std::allocator<spv::Instruction*>>::
      _M_realloc_insert<spv::Instruction*const&>(this_00,__position,&local_50);
      local_40._M_head_impl = local_50;
    }
    else {
      *__position._M_current = pIVar8;
      *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
      local_40._M_head_impl = pIVar8;
    }
    std::
    vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
    ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
              ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
                *)&this->constantsTypesGlobals,
               (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_40);
    if (local_40._M_head_impl != (Instruction *)0x0) {
      (*(local_40._M_head_impl)->_vptr_Instruction[1])();
    }
    Module::mapInstruction(&this->module,local_50);
    IVar5 = local_50->resultId;
  }
  return IVar5;
}

Assistant:

Id Builder::makePointerDebugType(StorageClass storageClass, Id const baseType)
{
    const Id debugBaseType = debugId[baseType];
    if (!debugBaseType) {
        return makeDebugInfoNone();
    }
    const Id scID = makeUintConstant(storageClass);
    for (Instruction* otherType : groupedDebugTypes[NonSemanticShaderDebugInfo100DebugTypePointer]) {
        if (otherType->getIdOperand(2) == debugBaseType &&
            otherType->getIdOperand(3) == scID) {
            return otherType->getResultId();
        }
    }

    Instruction* type = new Instruction(getUniqueId(), makeVoidType(), OpExtInst);
    type->reserveOperands(5);
    type->addIdOperand(nonSemanticShaderDebugInfo);
    type->addImmediateOperand(NonSemanticShaderDebugInfo100DebugTypePointer);
    type->addIdOperand(debugBaseType);
    type->addIdOperand(scID);
    type->addIdOperand(makeUintConstant(0));

    groupedDebugTypes[NonSemanticShaderDebugInfo100DebugTypePointer].push_back(type);
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(type));
    module.mapInstruction(type);

    return type->getResultId();
}